

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O1

bool filesystem::create_subdirectory(path *p)

{
  bool bVar1;
  __mode_t __mask;
  int iVar2;
  __normal_iterator<filesystem::path_*,_std::vector<filesystem::path,_std::allocator<filesystem::path>_>_>
  __tmp;
  pointer this;
  bool bVar3;
  vector<filesystem::path,_std::allocator<filesystem::path>_> hierarchy;
  path tmp;
  vector<filesystem::path,_std::allocator<filesystem::path>_> local_b8;
  undefined1 local_98 [32];
  bool local_78;
  value_type local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_70.m_type = p->m_type;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_70.m_path,&p->m_path);
  local_70.m_absolute = p->m_absolute;
  local_b8.super__Vector_base<filesystem::path,_std::allocator<filesystem::path>_>._M_impl.
  super__Vector_impl_data._M_start = (path *)0x0;
  local_b8.super__Vector_base<filesystem::path,_std::allocator<filesystem::path>_>._M_impl.
  super__Vector_impl_data._M_finish = (path *)0x0;
  local_b8.super__Vector_base<filesystem::path,_std::allocator<filesystem::path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_70.m_path.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_70.m_path.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::vector<filesystem::path,_std::allocator<filesystem::path>_>::push_back
                (&local_b8,&local_70);
      path::parent_path((path *)local_98,&local_70);
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_70.m_path.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_70.m_path.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_70.m_path.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_70.m_type = local_98._0_4_;
      local_70.m_path.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_98._8_8_;
      local_70.m_path.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_98._16_8_;
      local_70.m_path.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_98._24_8_;
      local_98._8_8_ = (pointer)0x0;
      local_98._16_8_ = (pointer)0x0;
      local_98._24_8_ = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      local_70.m_absolute = local_78;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_98 + 8));
    } while (local_70.m_path.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_70.m_path.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  bVar3 = local_b8.super__Vector_base<filesystem::path,_std::allocator<filesystem::path>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_b8.super__Vector_base<filesystem::path,_std::allocator<filesystem::path>_>._M_impl.
          super__Vector_impl_data._M_start;
  if (!bVar3) {
    this = local_b8.super__Vector_base<filesystem::path,_std::allocator<filesystem::path>_>._M_impl.
           super__Vector_impl_data._M_finish;
    do {
      this = this + -1;
      bVar1 = path::exists(this);
      if (!bVar1) {
        bVar1 = path::is_directory(this);
        if (!bVar1) {
          __mask = umask(0);
          path::str_abi_cxx11_((string *)local_98,this,native_path);
          iVar2 = mkdir((char *)CONCAT44(local_98._4_4_,local_98._0_4_),0x1ff);
          if ((undefined1 *)CONCAT44(local_98._4_4_,local_98._0_4_) != local_98 + 0x10) {
            operator_delete((undefined1 *)CONCAT44(local_98._4_4_,local_98._0_4_),
                            (ulong)(local_98._16_8_ + 1));
          }
          umask(__mask);
          if (iVar2 != 0) break;
        }
      }
      bVar3 = this == local_b8.
                      super__Vector_base<filesystem::path,_std::allocator<filesystem::path>_>.
                      _M_impl.super__Vector_impl_data._M_start;
    } while (!bVar3);
  }
  std::vector<filesystem::path,_std::allocator<filesystem::path>_>::~vector(&local_b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70.m_path);
  return bVar3;
}

Assistant:

inline bool create_subdirectory(const path& p) {
    auto tmp = p;
    std::vector<path> hierarchy;
    while (!tmp.empty()) {
        hierarchy.push_back(tmp);
        tmp = tmp.parent_path();
    }

    for (auto ancestor = hierarchy.rbegin(); ancestor != hierarchy.rend(); ++ancestor) {
        if (ancestor->exists())
            continue;
        if (!create_directory(*ancestor))
            return false;
    }

    return true;
}